

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

OpenRangeExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OpenRangeExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  OpenRangeExpressionSyntax *pOVar16;
  
  pOVar16 = (OpenRangeExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OpenRangeExpressionSyntax *)this->endPtr < pOVar16 + 1) {
    pOVar16 = (OpenRangeExpressionSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pOVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar12 = args_4->kind;
  uVar13 = args_4->field_0x2;
  NVar14.raw = (args_4->numFlags).raw;
  uVar15 = args_4->rawLen;
  pIVar3 = args_4->info;
  (pOVar16->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pOVar16->super_ExpressionSyntax).super_SyntaxNode.kind = OpenRangeExpression;
  (pOVar16->openBracket).kind = TVar4;
  (pOVar16->openBracket).field_0x2 = uVar5;
  (pOVar16->openBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pOVar16->openBracket).rawLen = uVar7;
  (pOVar16->openBracket).info = pIVar1;
  (pOVar16->left).ptr = args_1;
  (pOVar16->colon).kind = TVar8;
  (pOVar16->colon).field_0x2 = uVar9;
  (pOVar16->colon).numFlags = (NumericTokenFlags)NVar10.raw;
  (pOVar16->colon).rawLen = uVar11;
  (pOVar16->colon).info = pIVar2;
  (pOVar16->right).ptr = args_3;
  (pOVar16->closeBracket).kind = TVar12;
  (pOVar16->closeBracket).field_0x2 = uVar13;
  (pOVar16->closeBracket).numFlags = (NumericTokenFlags)NVar14.raw;
  (pOVar16->closeBracket).rawLen = uVar15;
  (pOVar16->closeBracket).info = pIVar3;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pOVar16;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pOVar16;
  return pOVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }